

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_6::CertIssuersIter::AddIssuers
          (CertIssuersIter *this,ParsedCertificateList *new_issuers)

{
  pointer *ppIVar1;
  __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  pointer __first;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  __optional_ne_t<bssl::der::Input,_bssl::der::Input> _Var5;
  iterator iVar6;
  CertificateTrust CVar7;
  Input *__rhs;
  ulong uVar8;
  pointer __result;
  pointer pIVar9;
  pointer pIVar10;
  uint uVar11;
  undefined *puVar12;
  _Tp_alloc_type *__alloc;
  size_t __n;
  ulong uVar13;
  ulong uVar14;
  __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> *__r;
  IssuerEntry entry;
  undefined4 extraout_var;
  
  __r = &((new_issuers->
          super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
          )._M_impl.super__Vector_impl_data._M_start)->
         super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>;
  p_Var2 = &((new_issuers->
             super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
             )._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>;
  do {
    if (__r == p_Var2) {
      return;
    }
    entry.cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(__r->_M_ptr->cert_).data_.data_;
    entry.cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)(__r->_M_ptr->cert_).data_.size_;
    iVar6 = ::std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(this->present_issuers_)._M_h,(key_type *)&entry);
    if (iVar6.super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      entry.cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(__r->_M_ptr->cert_).data_.data_;
      entry.cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)(__r->_M_ptr->cert_).data_.size_;
      ::std::__detail::
      _Insert<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
      ::insert((_Insert<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                *)&this->present_issuers_,(value_type *)&entry);
      entry.cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      entry.cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      entry.trust.type = UNSPECIFIED;
      entry.trust.enforce_anchor_expiry = false;
      entry.trust.enforce_anchor_constraints = false;
      entry.trust.require_anchor_basic_constraints = false;
      entry.trust.require_leaf_selfsigned = false;
      ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> *)&entry,
                 __r);
      CVar7.type = (*(this->trust_store_->super_CertIssuerSource)._vptr_CertIssuerSource[4])
                             (this->trust_store_,
                              entry.cert.
                              super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
      CVar7.enforce_anchor_expiry = (bool)(char)extraout_var;
      CVar7.enforce_anchor_constraints = (bool)(char)((uint)extraout_var >> 8);
      CVar7.require_anchor_basic_constraints = (bool)(char)((uint)extraout_var >> 0x10);
      CVar7.require_leaf_selfsigned = (bool)(char)((uint)extraout_var >> 0x18);
      peVar3 = (this->cert_).
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      entry.trust = CVar7;
      if (((peVar3->authority_key_identifier_).
           super__Optional_base<bssl::ParsedAuthorityKeyIdentifier,_false,_false>._M_payload.
           super__Optional_payload<bssl::ParsedAuthorityKeyIdentifier,_true,_false,_false>.
           super__Optional_payload_base<bssl::ParsedAuthorityKeyIdentifier>._M_engaged == true) &&
         ((peVar3->authority_key_identifier_).
          super__Optional_base<bssl::ParsedAuthorityKeyIdentifier,_false,_false>._M_payload.
          super__Optional_payload<bssl::ParsedAuthorityKeyIdentifier,_true,_false,_false>.
          super__Optional_payload_base<bssl::ParsedAuthorityKeyIdentifier>._M_payload.field2[0x10]
          == '\x01')) {
        uVar11 = 1;
        if (((entry.cert.
              super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->subject_key_identifier_).super__Optional_base<bssl::der::Input,_true,_true>._M_payload
            .super__Optional_payload_base<bssl::der::Input>._M_engaged == true) {
          __rhs = ::std::optional<bssl::der::Input>::value
                            (&(entry.cert.
                               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->subject_key_identifier_);
          _Var5 = ::std::operator!=((optional<bssl::der::Input> *)&peVar3->authority_key_identifier_
                                    ,__rhs);
          uVar11 = (uint)_Var5 * 2;
          CVar7 = (CertificateTrust)((ulong)entry.trust & 0xffffffff);
        }
      }
      else {
        uVar11 = 1;
      }
      _Var4._M_pi = entry.cert.
                    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if (TRUSTED_LEAF < CVar7.type) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder.cc"
                      ,0xab,
                      "int bssl::(anonymous namespace)::TrustAndKeyIdentifierMatchToOrder(const ParsedCertificate *, const ParsedCertificate *, const CertificateTrust &)"
                     );
      }
      switch((ulong)CVar7 & 0xffffffff) {
      case 0:
        entry.trust_and_key_id_match_ordering = uVar11 + 6;
        goto LAB_00383804;
      default:
        puVar12 = &DAT_004637e0;
        break;
      case 2:
      case 3:
        puVar12 = &DAT_004637d4;
      }
      entry.trust_and_key_id_match_ordering = *(int *)(puVar12 + (ulong)uVar11 * 4);
LAB_00383804:
      pIVar10 = (this->issuers_).
                super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar10 ==
          (this->issuers_).
          super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __first = (this->issuers_).
                  super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((long)pIVar10 - (long)__first == 0x7fffffffffffffe0) {
          ::std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar13 = (long)pIVar10 - (long)__first >> 5;
        uVar8 = uVar13;
        if (pIVar10 == __first) {
          uVar8 = 1;
        }
        uVar14 = uVar8 + uVar13;
        if (0x3fffffffffffffe < uVar14) {
          uVar14 = 0x3ffffffffffffff;
        }
        if (CARRY8(uVar8,uVar13)) {
          uVar14 = 0x3ffffffffffffff;
        }
        if (uVar14 == 0) {
          __result = (pointer)0x0;
        }
        else {
          __result = (pointer)operator_new(uVar14 << 5);
        }
        _Var4._M_pi = entry.cert.
                      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        entry.cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        __result[uVar13].cert.
        super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             entry.cert.
             super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        __result[uVar13].cert.
        super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Var4._M_pi;
        entry.cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        __alloc = (_Tp_alloc_type *)&entry.trust;
        __result[uVar13].trust_and_key_id_match_ordering = entry.trust_and_key_id_match_ordering;
        __result[uVar13].trust = entry.trust;
        pIVar9 = ::std::
                 vector<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                 ::_S_relocate(__first,pIVar10,__result,__alloc);
        pIVar10 = ::std::
                  vector<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                  ::_S_relocate(pIVar10,pIVar10,pIVar9 + 1,__alloc);
        ::std::
        _Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
        ::_M_deallocate((_Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                         *)__first,
                        (pointer)((long)(this->issuers_).
                                        super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)__first >> 5),__n);
        (this->issuers_).
        super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
        ._M_impl.super__Vector_impl_data._M_start = __result;
        (this->issuers_).
        super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish = pIVar10;
        (this->issuers_).
        super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar14;
      }
      else {
        (pIVar10->cert).
        super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        entry.cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (pIVar10->cert).
        super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             entry.cert.
             super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (pIVar10->cert).
        super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Var4._M_pi;
        entry.cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        pIVar10->trust_and_key_id_match_ordering = entry.trust_and_key_id_match_ordering;
        pIVar10->trust = entry.trust;
        ppIVar1 = &(this->issuers_).
                   super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppIVar1 = *ppIVar1 + 1;
      }
      this->issuers_needs_sort_ = true;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&entry.cert.
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    __r = __r + 1;
  } while( true );
}

Assistant:

void CertIssuersIter::AddIssuers(ParsedCertificateList new_issuers) {
  for (std::shared_ptr<const ParsedCertificate> &issuer : new_issuers) {
    if (present_issuers_.find(BytesAsStringView(issuer->der_cert())) !=
        present_issuers_.end()) {
      continue;
    }
    present_issuers_.insert(BytesAsStringView(issuer->der_cert()));

    // Look up the trust for this issuer.
    IssuerEntry entry;
    entry.cert = std::move(issuer);
    entry.trust = trust_store_->GetTrust(entry.cert.get());
    entry.trust_and_key_id_match_ordering = TrustAndKeyIdentifierMatchToOrder(
        cert(), entry.cert.get(), entry.trust);

    issuers_.push_back(std::move(entry));
    issuers_needs_sort_ = true;
  }
}